

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void pipe_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  
  piVar2 = (int *)malloc(0x2978);
  if (piVar2 == (int *)0x0) {
    pipe_pinger_new_cold_3();
  }
  else {
    *piVar2 = vectored_writes;
    piVar2[1] = 0;
    piVar2[2] = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar3,piVar2 + 4,0);
    *(int **)(piVar2 + 4) = piVar2;
    if (iVar1 == 0) {
      uv_pipe_connect(piVar2 + 0x46,piVar2 + 4,"/tmp/uv-test-sock",pinger_on_connect);
      if (pinger_on_connect_count == 0) {
        return;
      }
      goto LAB_00164897;
    }
  }
  pipe_pinger_new_cold_1();
LAB_00164897:
  pipe_pinger_new_cold_2();
  pipe_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void pipe_pinger_new(int vectored_writes) {
  int r;
  pinger_t *pinger;

  pinger = (pinger_t*)malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0);
  pinger->stream.pipe.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  uv_pipe_connect(&pinger->connect_req, &pinger->stream.pipe, TEST_PIPENAME,
      pinger_on_connect);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}